

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  pointer pMVar3;
  IReporter *pIVar4;
  long in_RSI;
  SourceLineInfo *in_RDI;
  AssertionResult result;
  AssertionInfo info;
  ExpressionResultBuilder expressionBuilder;
  const_iterator itEnd;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  ExpressionResultBuilder *in_stack_fffffffffffffc20;
  allocator *in_stack_fffffffffffffc38;
  ExpressionResultBuilder *this_00;
  Flags _resultDisposition;
  string *_capturedExpression;
  string *in_stack_fffffffffffffc58;
  AssertionInfo *in_stack_fffffffffffffc60;
  allocator local_2e9;
  string local_2e8 [24];
  AssertionInfo *in_stack_fffffffffffffd30;
  ExpressionResultBuilder *in_stack_fffffffffffffd38;
  string local_248 [552];
  MessageInfo *local_20;
  const_iterator local_18;
  long local_10;
  
  local_10 = in_RSI;
  OVar2 = AssertionResult::getResultType((AssertionResult *)(in_RSI + 8));
  if (OVar2 != Ok) {
    local_18 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          in_stack_fffffffffffffc18);
    local_20 = (MessageInfo *)
               std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          in_stack_fffffffffffffc18);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffffc20,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffffc18), bVar1) {
      pMVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&stack0xffffffffffffffe8);
      OVar2 = (OfType)((ulong)in_stack_fffffffffffffc38 >> 0x20);
      if (pMVar3->type == Info) {
        this_00 = (ExpressionResultBuilder *)&stack0xffffffffffffffe8;
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)this_00);
        _capturedExpression = local_248;
        ExpressionResultBuilder::ExpressionResultBuilder(this_00,OVar2);
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)this_00);
        _resultDisposition = (Flags)((ulong)this_00 >> 0x20);
        ExpressionResultBuilder::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        in_stack_fffffffffffffc20 = (ExpressionResultBuilder *)&stack0xffffffffffffffe8;
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_fffffffffffffc20);
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_fffffffffffffc20);
        in_stack_fffffffffffffc38 = &local_2e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e8,"",in_stack_fffffffffffffc38);
        AssertionInfo::AssertionInfo
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_RDI,_capturedExpression,
                   _resultDisposition);
        std::__cxx11::string::~string(local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        ExpressionResultBuilder::buildResult(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        in_stack_fffffffffffffc18 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Ptr<Catch::IReporter>::operator->((Ptr<Catch::IReporter> *)&in_RDI->field_0x10);
        (**(code **)((long)*(IShared *)in_stack_fffffffffffffc18 + 0x80))
                  (in_stack_fffffffffffffc18,&stack0xfffffffffffffc58);
        AssertionResult::~AssertionResult((AssertionResult *)in_stack_fffffffffffffc20);
        AssertionInfo::~AssertionInfo((AssertionInfo *)in_stack_fffffffffffffc20);
        ExpressionResultBuilder::~ExpressionResultBuilder(in_stack_fffffffffffffc20);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&stack0xffffffffffffffe8);
    }
  }
  pIVar4 = Ptr<Catch::IReporter>::operator->((Ptr<Catch::IReporter> *)&in_RDI->field_0x10);
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar4,local_10 + 8);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
            for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                    it != itEnd;
                    ++it ) {
                if( it->type == ResultWas::Info ) {
                    ExpressionResultBuilder expressionBuilder( it->type );
                        expressionBuilder << it->message;
                    AssertionInfo info( it->macroName, it->lineInfo, "", ResultDisposition::Normal );
                    AssertionResult result = expressionBuilder.buildResult( info );
                    m_legacyReporter->Result( result );
                }
            }
        }
        m_legacyReporter->Result( assertionStats.assertionResult );
        return true;
    }